

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void r4k_invalidate_tlb_mips64el(CPUMIPSState_conflict5 *env,int idx,int use_extra)

{
  uint32_t *puVar1;
  CPUState *cpu;
  ulong *puVar2;
  ulong *puVar3;
  CPUMIPSTLBContext_conflict1 *pCVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  CPUMIPSState_conflict5 *__mptr;
  ulong uVar10;
  bool bVar11;
  
  cpu = (CPUState *)(env[-3].tcs[0xc].gpr + 0x12);
  uVar7 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  pCVar4 = env->tlb;
  bVar11 = (env->CP0_Config5 & 0x20000) != 0;
  if (bVar11) {
    uVar7 = env->CP0_MemoryMapID;
  }
  puVar2 = (ulong *)((long)&pCVar4->mmu + (long)idx * 0x28);
  if (bVar11) {
    uVar8 = (uint)puVar2[2];
  }
  else {
    uVar8 = (uint)*(ushort *)((long)puVar2 + 0xc);
  }
  if (((*(ushort *)((long)puVar2 + 0x14) & 1) != 0) || (uVar8 == uVar7)) {
    if ((use_extra == 0) || (uVar6 = (ulong)pCVar4->tlb_in_use, 0x7f < uVar6)) {
      uVar6 = (ulong)(uint)puVar2[1] | 0x1fff;
      if ((char)*(ushort *)((long)puVar2 + 0x14) < '\0') {
        uVar5 = *puVar2 & ~uVar6;
        uVar9 = uVar5 | 0x3fffff0000000000;
        if (uVar5 < (env->SEGMask & 0xffffffff80000000)) {
          uVar9 = uVar5;
        }
        uVar5 = uVar6 >> 1 | uVar9;
        do {
          tlb_flush_page_mips64el(cpu,uVar9);
          uVar9 = uVar9 + 0x1000;
        } while (uVar9 < uVar5);
      }
      if ((*(byte *)((long)puVar2 + 0x15) & 1) != 0) {
        uVar5 = (uVar6 >> 1) + 1 | ~uVar6 & *puVar2;
        uVar9 = uVar5 | 0x3fffff0000000000;
        if (uVar5 < (env->SEGMask & 0xffffffff80000000)) {
          uVar9 = uVar5;
        }
        uVar5 = uVar9 - 1;
        uVar10 = uVar9;
        while (uVar5 < (uVar6 | uVar9)) {
          tlb_flush_page_mips64el(cpu,uVar10);
          uVar5 = uVar10 + 0xfff;
          uVar10 = uVar10 + 0x1000;
        }
      }
    }
    else {
      *(ulong *)((long)&pCVar4->mmu + uVar6 * 0x28 + 0x20) = puVar2[4];
      uVar9 = *puVar2;
      uVar5 = puVar2[1];
      uVar10 = puVar2[3];
      puVar3 = (ulong *)((long)&pCVar4->mmu + uVar6 * 0x28 + 0x10);
      *puVar3 = puVar2[2];
      puVar3[1] = uVar10;
      puVar2 = (ulong *)((long)&pCVar4->mmu + uVar6 * 0x28);
      *puVar2 = uVar9;
      puVar2[1] = uVar5;
      puVar1 = &env->tlb->tlb_in_use;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void r4k_invalidate_tlb(CPUMIPSState *env, int idx, int use_extra)
{
    CPUState *cs = env_cpu(env);
    r4k_tlb_t *tlb;
    target_ulong addr;
    target_ulong end;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    target_ulong mask;

    MMID = mi ? MMID : (uint32_t) ASID;

    tlb = &env->tlb->mmu.r4k.tlb[idx];
    /*
     * The qemu TLB is flushed when the ASID/MMID changes, so no need to
     * flush these entries again.
     */
    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    if (tlb->G == 0 && tlb_mmid != MMID) {
        return;
    }

    if (use_extra && env->tlb->tlb_in_use < MIPS_TLB_MAX) {
        /*
         * For tlbwr, we can shadow the discarded entry into
         * a new (fake) TLB entry, as long as the guest can not
         * tell that it's there.
         */
        env->tlb->mmu.r4k.tlb[env->tlb->tlb_in_use] = *tlb;
        env->tlb->tlb_in_use++;
        return;
    }

    /* 1k pages are not supported. */
    mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
    if (tlb->V0) {
        addr = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        if (addr >= (0xFFFFFFFF80000000ULL & env->SEGMask)) {
            addr |= 0x3FFFFF0000000000ULL;
        }
#endif
        end = addr | (mask >> 1);
        while (addr < end) {
            tlb_flush_page(cs, addr);
            addr += TARGET_PAGE_SIZE;
        }
    }
    if (tlb->V1) {
        addr = (tlb->VPN & ~mask) | ((mask >> 1) + 1);
#if defined(TARGET_MIPS64)
        if (addr >= (0xFFFFFFFF80000000ULL & env->SEGMask)) {
            addr |= 0x3FFFFF0000000000ULL;
        }
#endif
        end = addr | mask;
        while (addr - 1 < end) {
            tlb_flush_page(cs, addr);
            addr += TARGET_PAGE_SIZE;
        }
    }
}